

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void errorOutput(string *errorMessage)

{
  int iVar1;
  ostream *poVar2;
  string *errorMessage_local;
  
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"============================================================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = std::__cxx11::string::compare((char *)errorMessage);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the names of the input and output files."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)errorMessage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "============================================================");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void errorOutput(string errorMessage) {
    cerr << endl << endl << "============================================================" << endl;
    if (errorMessage.compare("") == 0) {
        cerr <<
             "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the "
                     "names of the input and output files." << endl;
    } else {
        cerr << errorMessage << endl;
    }
    cerr << "============================================================" << endl << endl;
}